

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_dup_i64_vec_mips64el(TCGContext_conflict6 *tcg_ctx,uint vece,TCGv_vec r,TCGv_i64 a)

{
  undefined8 uVar1;
  TCGArg a_00;
  TCGTemp *pTVar2;
  TCGArg a_01;
  TCGArg ai;
  TCGType type;
  TCGTemp *rt;
  TCGArg ri;
  TCGv_i64 a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  a_00 = tcgv_vec_arg(tcg_ctx,r);
  pTVar2 = arg_temp(a_00);
  uVar1 = *(undefined8 *)pTVar2;
  a_01 = tcgv_i64_arg(tcg_ctx,a);
  vec_gen_2_mips64el(tcg_ctx,INDEX_op_dup_vec,(TCGType)((ulong)uVar1 >> 0x10) & 0xff,vece,a_00,a_01)
  ;
  return;
}

Assistant:

void tcg_gen_dup_i64_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_i64 a)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

#if TCG_TARGET_REG_BITS == 64
        TCGArg ai = tcgv_i64_arg(tcg_ctx, a);
        vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
#else
    if (vece == MO_64) {
        TCGArg al = tcgv_i32_arg(tcg_ctx, TCGV_LOW(tcg_ctx, a));
        TCGArg ah = tcgv_i32_arg(tcg_ctx, TCGV_HIGH(tcg_ctx, a));
        vec_gen_3(tcg_ctx, INDEX_op_dup2_vec, type, MO_64, ri, al, ah);
    } else {
        TCGArg ai = tcgv_i32_arg(tcg_ctx, TCGV_LOW(tcg_ctx, a));
        vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
    }
#endif
}